

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O0

Mini_Lut_t * Mini_LutStart(int LutSize)

{
  int iVar1;
  int iVar2;
  Mini_Lut_t *p_00;
  int *piVar3;
  uint *puVar4;
  int local_1c;
  int i;
  Mini_Lut_t *p;
  int LutSize_local;
  
  if ((1 < LutSize) && (LutSize < 0x11)) {
    p_00 = (Mini_Lut_t *)calloc(1,0x20);
    p_00->LutSize = LutSize;
    p_00->nCap = 0xff;
    piVar3 = (int *)malloc((long)(p_00->nCap * p_00->LutSize) << 2);
    p_00->pArray = piVar3;
    iVar2 = p_00->nCap;
    iVar1 = Mini_LutWordNum(p_00->LutSize);
    puVar4 = (uint *)malloc((long)(iVar2 * iVar1) << 2);
    p_00->pTruths = puVar4;
    Mini_LutPush(p_00,0,(int *)0x0,(uint *)0x0);
    Mini_LutPush(p_00,0,(int *)0x0,(uint *)0x0);
    local_1c = 0;
    while( true ) {
      iVar2 = Mini_LutWordNum(p_00->LutSize);
      if (iVar2 <= local_1c) break;
      p_00->pTruths[local_1c] = 0;
      local_1c = local_1c + 1;
    }
    local_1c = 0;
    while( true ) {
      iVar2 = Mini_LutWordNum(p_00->LutSize);
      if (iVar2 <= local_1c) break;
      puVar4 = p_00->pTruths;
      iVar2 = Mini_LutWordNum(p_00->LutSize);
      puVar4[iVar2 + local_1c] = 0xffffffff;
      local_1c = local_1c + 1;
    }
    return p_00;
  }
  __assert_fail("LutSize >= 2 && LutSize <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/minilut.h"
                ,0x96,"Mini_Lut_t *Mini_LutStart(int)");
}

Assistant:

static Mini_Lut_t * Mini_LutStart( int LutSize )
{
    Mini_Lut_t * p; int i;
    assert( LutSize >= 2 && LutSize <= 16 );
    p = MINI_LUT_CALLOC( Mini_Lut_t, 1 );
    p->LutSize = LutSize;
    p->nCap    = MINI_LUT_START_SIZE;
    p->pArray  = MINI_LUT_ALLOC( int,      p->nCap * p->LutSize );
    p->pTruths = MINI_LUT_ALLOC( unsigned, p->nCap * Mini_LutWordNum(p->LutSize) );
    Mini_LutPush( p, 0, NULL, NULL ); // const0
    Mini_LutPush( p, 0, NULL, NULL ); // const1
    for ( i = 0; i < Mini_LutWordNum(p->LutSize); i++ )
        p->pTruths[i] = 0;
    for ( i = 0; i < Mini_LutWordNum(p->LutSize); i++ )
        p->pTruths[Mini_LutWordNum(p->LutSize) + i] = ~0;
    return p;
}